

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidget::contextMenuEvent
          (QGraphicsProxyWidget *this,QGraphicsSceneContextMenuEvent *event)

{
  bool bVar1;
  Reason RVar2;
  KeyboardModifiers KVar3;
  QGraphicsProxyWidgetPrivate *pos_00;
  QWidget *pQVar4;
  quint64 timestamp;
  long *in_RSI;
  long in_FS_OFFSET;
  QGraphicsProxyWidgetPrivate *d;
  QPoint globalPos;
  QPointer<QWidget> receiver;
  QPointer<QWidget> alienWidget;
  QPointF pos;
  QContextMenuEvent contextMenuEvent;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QGraphicsSceneContextMenuEvent *in_stack_ffffffffffffff00;
  QGraphicsItem *in_stack_ffffffffffffff08;
  QPointF *in_stack_ffffffffffffff10;
  QWidget *in_stack_ffffffffffffff18;
  QGraphicsProxyWidgetPrivate *this_00;
  QGraphicsProxyWidgetPrivate *receiver_00;
  QPoint local_b0;
  QPoint local_a8;
  QPoint local_a0;
  QPoint local_98;
  QPointF local_90;
  undefined1 *local_80;
  undefined1 *local_78;
  QPoint local_70;
  undefined1 local_68 [24];
  undefined8 local_50;
  QContextMenuEvent local_48 [64];
  QHash<QWidget_*,_QRect> local_8;
  
  local_8.d = *(Data **)(in_FS_OFFSET + 0x28);
  pos_00 = d_func((QGraphicsProxyWidget *)0x9bbe55);
  if ((in_RSI != (long *)0x0) &&
     (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bbe73), bVar1)) {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bbe8a);
    bVar1 = QWidget::isVisible((QWidget *)0x9bbe92);
    if ((bVar1) && (bVar1 = QGraphicsItem::hasFocus(in_stack_ffffffffffffff08), bVar1)) {
      local_50 = 0xffffffffffffffff;
      local_68._16_8_ = 0xffffffffffffffff;
      join_0x00001240_0x00001200_ =
           QGraphicsSceneContextMenuEvent::pos
                     ((QGraphicsSceneContextMenuEvent *)in_stack_ffffffffffffff08);
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bbf18);
      local_70 = QPointF::toPoint(in_stack_ffffffffffffff10);
      QWidget::childAt(in_stack_ffffffffffffff18,(QPoint *)in_stack_ffffffffffffff10);
      QPointer<QWidget>::QPointer<void>
                ((QPointer<QWidget> *)in_stack_ffffffffffffff00,
                 (QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bbf7f);
      if (bVar1) {
        this_00 = (QGraphicsProxyWidgetPrivate *)local_68;
      }
      else {
        this_00 = (QGraphicsProxyWidgetPrivate *)&pos_00->widget;
      }
      QPointer<QWidget>::QPointer
                ((QPointer<QWidget> *)in_stack_ffffffffffffff00,
                 (QPointer<QWidget> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
      ;
      receiver_00 = pos_00;
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bbfcd);
      local_90 = QGraphicsProxyWidgetPrivate::mapToReceiver
                           (this_00,in_stack_ffffffffffffff10,(QWidget *)receiver_00);
      local_98 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      unique0x10000403 = local_90;
      pQVar4 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bc027);
      local_a0 = QPointF::toPoint((QPointF *)pQVar4);
      local_98 = QWidget::mapToGlobal(pQVar4,(QPoint *)pos_00);
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bc05f);
      bVar1 = bypassGraphicsProxyWidget
                        ((QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (bVar1) {
        local_a8 = QGraphicsSceneContextMenuEvent::screenPos(in_stack_ffffffffffffff00);
        local_98 = local_a8;
      }
      memset(local_48,0xaa,0x40);
      RVar2 = QGraphicsSceneContextMenuEvent::reason(in_stack_ffffffffffffff00);
      local_b0 = QPointF::toPoint((QPointF *)pQVar4);
      KVar3 = QGraphicsSceneContextMenuEvent::modifiers(in_stack_ffffffffffffff00);
      QContextMenuEvent::QContextMenuEvent
                (local_48,RVar2,(QPoint *)&local_b0,(QPoint *)&local_98,
                 (QFlags_conflict1 *)
                 (ulong)(uint)KVar3.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                              super_QFlagsStorage<Qt::KeyboardModifier>.i);
      timestamp = QGraphicsSceneEvent::timestamp((QGraphicsSceneEvent *)0x9bc0f5);
      QInputEvent::setTimestamp((QInputEvent *)local_48,timestamp);
      pQVar4 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bc112);
      QCoreApplication::sendEvent(&pQVar4->super_QObject,(QEvent *)local_48);
      bVar1 = QEvent::isAccepted((QEvent *)local_48);
      (**(code **)(*in_RSI + 0x10))(in_RSI,bVar1);
      QContextMenuEvent::~QContextMenuEvent(local_48);
      QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x9bc169);
      QPointer<QWidget>::~QPointer((QPointer<QWidget> *)0x9bc176);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) != local_8.d) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::contextMenuEvent(QGraphicsSceneContextMenuEvent *event)
{
    Q_D(QGraphicsProxyWidget);
    if (!event || !d->widget || !d->widget->isVisible() || !hasFocus())
        return;

    // Find widget position and receiver.
    QPointF pos = event->pos();
    QPointer<QWidget> alienWidget = d->widget->childAt(pos.toPoint());
    QPointer<QWidget> receiver =  alienWidget ? alienWidget : d->widget;

    // Map event position from us to the receiver
    pos = d->mapToReceiver(pos, receiver);

    QPoint globalPos = receiver->mapToGlobal(pos.toPoint());
    //If the receiver by-pass the proxy its popups
    //will be top level QWidgets therefore they need
    //the screen position. mapToGlobal expect the widget to
    //have proper coordinates in regards of the windowing system
    //but it's not true because the widget is embedded.
    if (bypassGraphicsProxyWidget(receiver))
        globalPos = event->screenPos();

    // Send mouse event. ### Doesn't propagate the event.
    QContextMenuEvent contextMenuEvent(QContextMenuEvent::Reason(event->reason()),
                                       pos.toPoint(), globalPos, event->modifiers());
    contextMenuEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(receiver, &contextMenuEvent);

    event->setAccepted(contextMenuEvent.isAccepted());
}